

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

void __thiscall chrono::ChStreamFile::Read(ChStreamFile *this,char *data,size_t n)

{
  std::istream::read((char *)&this->file,(long)data);
  return;
}

Assistant:

void ChStreamFile::Read(char* data, size_t n) {
    try {
        file.read(data, n);
    } catch (const std::exception&) {
        throw ChException("Cannot read from stream");
    };
}